

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCodeExprList(Parse *pParse,ExprList *pList,int target,int srcReg,u8 flags)

{
  Vdbe *p;
  Expr *pExpr;
  byte bVar1;
  uint in_EAX;
  Op *pOVar2;
  int iVar3;
  uint target_00;
  byte bVar4;
  int iVar5;
  int iVar6;
  anon_union_4_2_6146edf4_for_u *paVar7;
  Walker local_60;
  
  iVar5 = pList->nExpr;
  if (0 < iVar5) {
    bVar4 = flags & 0xfd;
    if (pParse->okConstFactor != '\0') {
      bVar4 = flags;
    }
    p = pParse->pVdbe;
    bVar1 = flags & 1 ^ 0x51;
    in_EAX = (uint)bVar1;
    paVar7 = &pList->a[0].u;
    iVar6 = 0;
    do {
      pExpr = ((ExprList_item *)(paVar7 + -5))->pExpr;
      if (((bVar4 & 4) == 0) || ((paVar7->x).iOrderByCol == 0)) {
        if ((bVar4 & 2) != 0) {
          local_60.eCode = 2;
          local_60.xExprCallback = exprNodeIsConstant;
          local_60.xSelectCallback = sqlite3SelectWalkFail;
          local_60.u.n = 0;
          if ((pExpr == (Expr *)0x0) || (walkExpr(&local_60,pExpr), local_60.eCode != 0)) {
            in_EAX = sqlite3ExprCodeRunJustOnce(pParse,pExpr,iVar6 + target);
            goto LAB_00169024;
          }
        }
        target_00 = target + iVar6;
        in_EAX = sqlite3ExprCodeTarget(pParse,pExpr,target_00);
        if (in_EAX != target_00) {
          if ((flags & 1) != 0) {
            pOVar2 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (p->db->mallocFailed == '\0') {
              pOVar2 = p->aOp + (long)p->nOp + -1;
            }
            if ((((pOVar2->opcode == 'P') && (iVar3 = pOVar2->p3 + 1, pOVar2->p1 + iVar3 == in_EAX))
                && (pOVar2->p2 + iVar3 == target_00)) && (pOVar2->p5 == 0)) {
              pOVar2->p3 = iVar3;
              goto LAB_00169024;
            }
          }
          in_EAX = sqlite3VdbeAddOp3(p,(uint)bVar1,in_EAX,target_00,0);
        }
      }
      else if ((bVar4 & 8) == 0) {
        in_EAX = sqlite3VdbeAddOp3(p,(uint)bVar1,(uint)(paVar7->x).iOrderByCol + srcReg + -1,
                                   iVar6 + target,0);
      }
      else {
        iVar6 = iVar6 + -1;
        iVar5 = iVar5 + -1;
      }
LAB_00169024:
      iVar6 = iVar6 + 1;
      paVar7 = paVar7 + 6;
    } while (iVar6 < iVar5);
  }
  return in_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeExprList(
  Parse *pParse,     /* Parsing context */
  ExprList *pList,   /* The expression list to be coded */
  int target,        /* Where to write results */
  int srcReg,        /* Source registers if SQLITE_ECEL_REF */
  u8 flags           /* SQLITE_ECEL_* flags */
){
  struct ExprList_item *pItem;
  int i, j, n;
  u8 copyOp = (flags & SQLITE_ECEL_DUP) ? OP_Copy : OP_SCopy;
  Vdbe *v = pParse->pVdbe;
  assert( pList!=0 );
  assert( target>0 );
  assert( pParse->pVdbe!=0 );  /* Never gets this far otherwise */
  n = pList->nExpr;
  if( !ConstFactorOk(pParse) ) flags &= ~SQLITE_ECEL_FACTOR;
  for(pItem=pList->a, i=0; i<n; i++, pItem++){
    Expr *pExpr = pItem->pExpr;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( pItem->fg.bSorterRef ){
      i--;
      n--;
    }else
#endif
    if( (flags & SQLITE_ECEL_REF)!=0 && (j = pItem->u.x.iOrderByCol)>0 ){
      if( flags & SQLITE_ECEL_OMITREF ){
        i--;
        n--;
      }else{
        sqlite3VdbeAddOp2(v, copyOp, j+srcReg-1, target+i);
      }
    }else if( (flags & SQLITE_ECEL_FACTOR)!=0
           && sqlite3ExprIsConstantNotJoin(pExpr)
    ){
      sqlite3ExprCodeRunJustOnce(pParse, pExpr, target+i);
    }else{
      int inReg = sqlite3ExprCodeTarget(pParse, pExpr, target+i);
      if( inReg!=target+i ){
        VdbeOp *pOp;
        if( copyOp==OP_Copy
         && (pOp=sqlite3VdbeGetOp(v, -1))->opcode==OP_Copy
         && pOp->p1+pOp->p3+1==inReg
         && pOp->p2+pOp->p3+1==target+i
         && pOp->p5==0  /* The do-not-merge flag must be clear */
        ){
          pOp->p3++;
        }else{
          sqlite3VdbeAddOp2(v, copyOp, inReg, target+i);
        }
      }
    }
  }
  return n;
}